

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void jpgd::jpeg_decoder::decode_block_ac_refine
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  byte bVar1;
  short sVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  jpgd_block_t *pjVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint local_3c;
  
  bVar1 = (byte)pD->m_successive_low;
  uVar9 = 1 << (bVar1 & 0x1f);
  uVar8 = -1 << (bVar1 & 0x1f);
  pjVar6 = coeff_buf_getp(pD,pD->m_ac_coeffs[component_id],block_x,block_y);
  iVar11 = pD->m_spectral_end;
  if (0x3f < iVar11) {
    __assert_fail("pD->m_spectral_end <= 63",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/jpgd.cpp"
                  ,0xa7b,
                  "static void jpgd::jpeg_decoder::decode_block_ac_refine(jpeg_decoder *, int, int, int)"
                 );
  }
  uVar10 = pD->m_spectral_start;
  iVar7 = pD->m_eob_run;
  if (iVar7 == 0) {
    while ((int)uVar10 <= iVar11) {
      uVar4 = huff_decode(pD,pD->m_pHuff_tabs[pD->m_comp_ac_tab[component_id]]);
      iVar11 = (int)uVar4 >> 4;
      if ((uVar4 & 0xf) == 0) {
        local_3c = 0;
        if (iVar11 != 0xf) {
          iVar7 = 1 << ((byte)iVar11 & 0x1f);
          pD->m_eob_run = iVar7;
          if (0xf < uVar4) {
            uVar5 = get_bits_no_markers(pD,iVar11);
            iVar7 = uVar5 + pD->m_eob_run;
            pD->m_eob_run = iVar7;
          }
          goto LAB_0010a4b7;
        }
      }
      else {
        if ((uVar4 & 0xf) != 1) {
          stop_decoding(pD,JPGD_DECODE_ERROR);
        }
        uVar5 = get_bits_no_markers(pD,1);
        local_3c = uVar9;
        if (uVar5 == 0) {
          local_3c = uVar8;
        }
      }
      do {
        iVar7 = *(int *)(g_ZAG + (ulong)(uVar10 & 0x3f) * 4);
        if (pjVar6[iVar7] == 0) {
          uVar4 = uVar10;
          if (iVar11 < 1) break;
          iVar11 = iVar11 + -1;
        }
        else {
          uVar5 = get_bits_no_markers(pD,1);
          if ((uVar5 != 0) && (sVar2 = pjVar6[iVar7], (uVar9 & (int)sVar2) == 0)) {
            uVar4 = uVar9;
            if (sVar2 < 0) {
              uVar4 = uVar8;
            }
            pjVar6[iVar7] = (short)uVar4 + sVar2;
          }
        }
        uVar4 = uVar10 + 1;
        bVar3 = (int)uVar10 < pD->m_spectral_end;
        uVar10 = uVar4;
      } while (bVar3);
      if ((local_3c != 0) && ((int)uVar4 < 0x40)) {
        pjVar6[*(int *)(g_ZAG + (long)(int)uVar4 * 4)] = (jpgd_block_t)local_3c;
      }
      iVar11 = pD->m_spectral_end;
      uVar10 = uVar4 + 1;
    }
    iVar7 = pD->m_eob_run;
  }
LAB_0010a4b7:
  if (0 < iVar7) {
    for (; (int)uVar10 <= pD->m_spectral_end; uVar10 = uVar10 + 1) {
      iVar11 = *(int *)(g_ZAG + (ulong)(uVar10 & 0x3f) * 4);
      if (((pjVar6[iVar11] != 0) && (uVar5 = get_bits_no_markers(pD,1), uVar5 != 0)) &&
         (sVar2 = pjVar6[iVar11], (uVar9 & (int)sVar2) == 0)) {
        uVar4 = uVar9;
        if (sVar2 < 0) {
          uVar4 = uVar8;
        }
        pjVar6[iVar11] = (short)uVar4 + sVar2;
      }
    }
    pD->m_eob_run = pD->m_eob_run + -1;
  }
  return;
}

Assistant:

void jpeg_decoder::decode_block_ac_refine(jpeg_decoder *pD, int component_id, int block_x, int block_y)
{
  int s, k, r;
  int p1 = 1 << pD->m_successive_low;
  int m1 = (-1) << pD->m_successive_low;
  jpgd_block_t *p = pD->coeff_buf_getp(pD->m_ac_coeffs[component_id], block_x, block_y);
  
  JPGD_ASSERT(pD->m_spectral_end <= 63);
  
  k = pD->m_spectral_start;
  
  if (pD->m_eob_run == 0)
  {
    for ( ; k <= pD->m_spectral_end; k++)
    {
      s = pD->huff_decode(pD->m_pHuff_tabs[pD->m_comp_ac_tab[component_id]]);

      r = s >> 4;
      s &= 15;

      if (s)
      {
        if (s != 1)
          pD->stop_decoding(JPGD_DECODE_ERROR);

        if (pD->get_bits_no_markers(1))
          s = p1;
        else
          s = m1;
      }
      else
      {
        if (r != 15)
        {
          pD->m_eob_run = 1 << r;

          if (r)
            pD->m_eob_run += pD->get_bits_no_markers(r);

          break;
        }
      }

      do
      {
        jpgd_block_t *this_coef = p + g_ZAG[k & 63];

        if (*this_coef != 0)
        {
          if (pD->get_bits_no_markers(1))
          {
            if ((*this_coef & p1) == 0)
            {
              if (*this_coef >= 0)
                *this_coef = static_cast<jpgd_block_t>(*this_coef + p1);
              else
                *this_coef = static_cast<jpgd_block_t>(*this_coef + m1);
            }
          }
        }
        else
        {
          if (--r < 0)
            break;
        }

        k++;

      } while (k <= pD->m_spectral_end);

      if ((s) && (k < 64))
      {
        p[g_ZAG[k]] = static_cast<jpgd_block_t>(s);
      }
    }
  }

  if (pD->m_eob_run > 0)
  {
    for ( ; k <= pD->m_spectral_end; k++)
    {
      jpgd_block_t *this_coef = p + g_ZAG[k & 63]; // logical AND to shut up static code analysis

      if (*this_coef != 0)
      {
        if (pD->get_bits_no_markers(1))
        {
          if ((*this_coef & p1) == 0)
          {
            if (*this_coef >= 0)
              *this_coef = static_cast<jpgd_block_t>(*this_coef + p1);
            else
              *this_coef = static_cast<jpgd_block_t>(*this_coef + m1);
          }
        }
      }
    }

    pD->m_eob_run--;
  }
}